

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

CURLcode curl_easy_send(Curl_easy *data,void *buffer,size_t buflen,size_t *n)

{
  _Bool _Var1;
  CURLcode CVar2;
  CURLcode CVar3;
  curl_socket_t sfd;
  connectdata *c;
  ssize_t n1;
  curl_socket_t local_34;
  connectdata *local_30;
  size_t local_28;
  
  local_30 = (connectdata *)0x0;
  _Var1 = Curl_is_in_callback(data);
  CVar2 = CURLE_RECURSIVE_API_CALL;
  if (!_Var1) {
    CVar2 = easy_connection(data,&local_34,&local_30);
    if (CVar2 == CURLE_OK) {
      *n = 0;
      CVar3 = Curl_write(local_30,local_34,buffer,buflen,(ssize_t *)&local_28);
      if (local_28 == 0xffffffffffffffff) {
        CVar2 = CURLE_SEND_ERROR;
      }
      else {
        CVar2 = CURLE_AGAIN;
        if (CVar3 != CURLE_OK || local_28 != 0) {
          *n = local_28;
          CVar2 = CVar3;
        }
      }
    }
  }
  return CVar2;
}

Assistant:

CURLcode curl_easy_send(struct Curl_easy *data, const void *buffer,
                        size_t buflen, size_t *n)
{
  curl_socket_t sfd;
  CURLcode result;
  ssize_t n1;
  struct connectdata *c = NULL;

  if(Curl_is_in_callback(data))
    return CURLE_RECURSIVE_API_CALL;

  result = easy_connection(data, &sfd, &c);
  if(result)
    return result;

  *n = 0;
  result = Curl_write(c, sfd, buffer, buflen, &n1);

  if(n1 == -1)
    return CURLE_SEND_ERROR;

  /* detect EAGAIN */
  if(!result && !n1)
    return CURLE_AGAIN;

  *n = (size_t)n1;

  return result;
}